

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O1

RC __thiscall PF_FileHandle::DisposePage(PF_FileHandle *this,PageNum pageNum)

{
  RC RVar1;
  RC RVar2;
  int *in_RAX;
  char *pPageBuf;
  int *local_18;
  
  if (this->bFileOpen != 0) {
    RVar1 = 3;
    if ((-1 < pageNum) && (pageNum < (this->hdr).numPages)) {
      local_18 = in_RAX;
      RVar1 = PF_BufferMgr::GetPage(this->pBufferMgr,this->unixfd,pageNum,(char **)&local_18,0);
      if (RVar1 == 0) {
        if (*local_18 == -2) {
          *local_18 = (this->hdr).firstFree;
          (this->hdr).firstFree = pageNum;
          this->bHdrChanged = 1;
          RVar1 = MarkDirty(this,pageNum);
          if (RVar1 == 0) {
            RVar1 = UnpinPage(this,pageNum);
          }
        }
        else {
          RVar2 = UnpinPage(this,pageNum);
          RVar1 = 6;
          if (RVar2 != 0) {
            RVar1 = RVar2;
          }
        }
      }
    }
    return RVar1;
  }
  return 5;
}

Assistant:

RC PF_FileHandle::DisposePage(PageNum pageNum)
{
   int     rc;               // return code
   char    *pPageBuf;        // address of page in buffer pool

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number
   if (!IsValidPageNum(pageNum))
      return (PF_INVALIDPAGE);

   // Get the page (but don't re-pin it if it's already pinned)
   if ((rc = pBufferMgr->GetPage(unixfd,
         pageNum,
         &pPageBuf,
         FALSE)))
      return (rc);

   // Page must be valid (used)
   if (((PF_PageHdr *)pPageBuf)->nextFree != PF_PAGE_USED) {

      // Unpin the page
      if ((rc = UnpinPage(pageNum)))
         return (rc);

      // Return page already free
      return (PF_PAGEFREE);
   }

   // Put this page onto the free list
   ((PF_PageHdr *)pPageBuf)->nextFree = hdr.firstFree;
   hdr.firstFree = pageNum;
   bHdrChanged = TRUE;

   // Mark the page dirty because we changed the next pointer
   if ((rc = MarkDirty(pageNum)))
      return (rc);

   // Unpin the page
   if ((rc = UnpinPage(pageNum)))
      return (rc);

   // Return ok
   return (0);
}